

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O1

string * __thiscall
cmCryptoHash::HashFile(string *__return_storage_ptr__,cmCryptoHash *this,string *file)

{
  uint uVar1;
  ifstream fin;
  cm_sha2_uint64_t buffer [512];
  long local_1230;
  int local_1228;
  uint auStack_1210 [122];
  undefined1 local_1028 [4104];
  
  std::ifstream::ifstream(&local_1230,(file->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((*(byte *)((long)auStack_1210 + *(long *)(local_1230 + -0x18)) & 5) == 0) {
    (*this->_vptr_cmCryptoHash[2])(this);
    uVar1 = *(uint *)((long)auStack_1210 + *(long *)(local_1230 + -0x18));
    if ((uVar1 & 5) == 0) {
      do {
        std::istream::read((char *)&local_1230,(long)local_1028);
        if (local_1228 != 0) {
          (*this->_vptr_cmCryptoHash[3])(this,local_1028);
        }
        uVar1 = *(uint *)((long)auStack_1210 + *(long *)(local_1230 + -0x18));
      } while ((uVar1 & 5) == 0);
    }
    if ((uVar1 & 2) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      (*this->_vptr_cmCryptoHash[4])(__return_storage_ptr__,this);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  std::ifstream::~ifstream(&local_1230);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::HashFile(const std::string& file)
{
  cmsys::ifstream fin(file.c_str(), std::ios::in | std::ios::binary);
  if(!fin)
    {
    return "";
    }

  this->Initialize();

  // Should be efficient enough on most system:
  cm_sha2_uint64_t buffer[512];
  char* buffer_c = reinterpret_cast<char*>(buffer);
  unsigned char const* buffer_uc =
    reinterpret_cast<unsigned char const*>(buffer);
  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while(fin)
    {
    fin.read(buffer_c, sizeof(buffer));
    if(int gcount = static_cast<int>(fin.gcount()))
      {
      this->Append(buffer_uc, gcount);
      }
    }
  if(fin.eof())
    {
    return this->Finalize();
    }
  return "";
}